

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

lbool __thiscall Minisat::Solver::search(Solver *this,int *nof_conflicts)

{
  uint64_t *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  vec<Minisat::Lit> *ps;
  bool bVar6;
  bool bVar7;
  int iVar8;
  CRef cind;
  Lit LVar9;
  decision_heuristic dVar10;
  uint uVar11;
  ulong uVar12;
  uint64_t uVar13;
  int *piVar14;
  long lVar15;
  byte bVar16;
  CRef from;
  long lVar17;
  byte bVar18;
  uint bLevel;
  bool bVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  ConflictData CVar24;
  CRef cr;
  int lbd;
  int backtrack_level;
  CRef local_b4;
  uint local_b0;
  undefined4 local_ac;
  ulong local_a8;
  vec<Minisat::Lit> *local_a0;
  uint local_98;
  uint local_94;
  ulong local_90;
  uint local_88;
  uint local_84;
  vec<unsigned_int> *local_80;
  int *local_78;
  vec<unsigned_int> *local_70;
  int *local_68;
  vec<unsigned_int> *local_60;
  ClauseAllocator *local_58;
  MyQueue<int> *local_50;
  undefined1 local_48 [16];
  
  if ((this->learnt_clause).data != (Lit *)0x0) {
    (this->learnt_clause).sz = 0;
  }
  this->starts = this->starts + 1;
  this->freeze_ls_restart_num = this->freeze_ls_restart_num + -1;
  local_78 = nof_conflicts;
  if ((this->consumeSharedCls != (_func_void_void_ptr *)0x0) && (this->receiveClauses == true)) {
    (*this->consumeSharedCls)(this->issuer);
  }
  if ((this->allow_rephasing == true) &&
     (uVar12 = this->state_change_time, uVar12 < (long)this->solve_starts + this->starts)) {
    if (this->called_initial_sls == false) {
      call_ls(this,false);
      uVar12 = this->state_change_time;
    }
    auVar21._8_4_ = (int)(uVar12 >> 0x20);
    auVar21._0_8_ = uVar12;
    auVar21._12_4_ = 0x45300000;
    dVar20 = (auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0) +
             this->state_change_time_inc;
    uVar12 = (ulong)dVar20;
    this->state_change_time = (long)(dVar20 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f | uVar12
    ;
    this->state_change_time_inc = this->state_change_time_inc * this->state_change_time_inc_inc;
    iVar8 = rand();
    if (iVar8 % 100 < 0x32) {
      info_based_rephase(this);
    }
    else {
      rand_based_rephase(this);
    }
  }
  if ((this->lcm == true) && (this->nbconfbeforesimplify * this->curSimplify <= this->conflicts)) {
    if (0 < this->verbosity) {
      printf("c schedule LCM with: nbClauses: %d, nbLearnts_core: %d, nbLearnts_tier2: %d, nbLearnts_local: %d, nbLearnts: %d\n"
             ,(ulong)(uint)(this->clauses).sz);
    }
    this->nbSimplifyAll = this->nbSimplifyAll + 1;
    bVar6 = simplifyAll(this);
    if (!bVar6) {
      return (lbool)'\x01';
    }
    this->curSimplify = this->conflicts / this->nbconfbeforesimplify + 1;
    this->nbconfbeforesimplify = (long)this->incSimplify + this->nbconfbeforesimplify;
  }
  if (this->ok != true) {
    return (lbool)'\x01';
  }
  local_a0 = &this->learnt_clause;
  inprocessing(this);
  prefetchAssumptions(this);
  local_50 = &this->lbd_queue;
  local_58 = &this->ca;
  local_60 = &this->learnts_core;
  local_80 = &this->learnts_local;
  local_70 = &this->learnts_tier2;
  local_68 = &(this->trail).sz;
  local_ac = (undefined4)CONCAT71((int7)((ulong)local_68 >> 8),1);
  cind = 0xffffffff;
  bVar6 = false;
LAB_00118f6d:
  do {
    local_a8 = CONCAT44(local_a8._4_4_,cind);
    while (cind = propagate(this), cind == 0xffffffff) {
      uVar12 = (long)this->solve_starts + this->starts;
      if (this->state_change_time < uVar12) {
        if ((((this->freeze_ls_restart_num < 1 & (byte)local_ac) == 1) &&
            (local_ac = (undefined4)CONCAT71((int7)(uVar12 >> 8),1), this->mediation_used == true))
           && ((iVar8 = (this->trail).sz,
               (int)((float)(this->vardata).sz * this->conflict_ratio) < iVar8 ||
               ((int)((float)this->max_trail * this->percent_ratio) < iVar8)))) {
          this->mediation_used = false;
          this->freeze_ls_restart_num = this->restarts_gap;
          bVar7 = call_ls(this,true);
          if (bVar7) {
            this->solved_by_ls = true;
            return (lbool)'\0';
          }
          local_ac = 0;
        }
      }
      if (this->current_heuristic < CHB) {
        bVar19 = true;
        bVar7 = !bVar6;
        bVar6 = bVar19;
        if (((bVar7) && (iVar8 = (this->lbd_queue).q_sz, iVar8 == (this->lbd_queue).max_sz)) &&
           (this->global_lbd_sum / (float)this->conflicts_VSIDS <
            (float)(int)((this->lbd_queue).sum / (long)iVar8) * this->lbd_avg_compare_limit))
        goto LAB_0011984b;
      }
      else if (*local_78 < 1) goto LAB_0011984b;
      if ((((this->asynch_interrupt != false) ||
           ((-1 < this->conflict_budget && ((ulong)this->conflict_budget <= this->conflicts)))) ||
          ((-1 < this->propagation_budget && ((ulong)this->propagation_budget <= this->propagations)
           ))) || ((this->termCallback != (_func_int_void_ptr *)0x0 &&
                   (iVar8 = (*this->termCallback)(this->termCallbackState), iVar8 != 0)))) {
LAB_0011984b:
        (this->lbd_queue).sum = 0;
        (this->lbd_queue).q_sz = 0;
        (this->lbd_queue).ptr = 0;
        dVar20 = progressEstimate(this);
        this->progress_estimate = dVar20;
        uVar11 = getRestartLevel(this);
        if (3 < this->verbosity) {
          printf("c trigger restart with target level %d from %d\n",(ulong)uVar11,
                 (ulong)(uint)(this->trail_lim).sz);
        }
        uVar3 = (this->assumptions).sz;
        bLevel = uVar3;
        if ((int)uVar3 < (int)uVar11) {
          bLevel = uVar11;
        }
        if (uVar3 == 0) {
          bLevel = uVar11;
        }
        cancelUntil(this,bLevel,false);
        return (lbool)'\x02';
      }
      if (((this->trail_lim).sz == 0) && (bVar7 = simplify(this), !bVar7)) {
        return (lbool)'\x01';
      }
      if ((this->core_size_lim != -1) && (this->core_size_lim < (this->learnts_core).sz)) {
        bVar7 = reduceDB_Core(this);
        iVar8 = (int)((float)this->core_size_lim * this->core_size_lim_inc +
                     (float)this->core_size_lim);
        this->core_size_lim = iVar8;
        if (!bVar7) {
          fVar23 = (float)iVar8;
          this->core_size_lim = (int)(this->core_size_lim_inc * fVar23 + fVar23);
        }
      }
      if (7000 < (this->learnts_tier2).sz) {
        reduceDB_Tier2(this);
      }
      if (this->next_L_reduce <= this->conflicts) {
        this->next_L_reduce = this->conflicts + 15000;
        reduceDB(this);
      }
      while (iVar8 = (this->trail_lim).sz, iVar8 < (this->assumptions).sz) {
        LVar9.x = (this->assumptions).data[iVar8].x;
        bVar18 = (this->assigns).data[LVar9.x >> 1].value;
        bVar16 = (byte)LVar9.x & 1;
        if (bVar18 != bVar16) {
          if ((bVar18 ^ bVar16) == 1) {
            analyzeFinal(this,(Lit)(LVar9.x ^ 1),&this->conflict);
            return (lbool)'\x01';
          }
          if (LVar9.x != 0xfffffffe) goto LAB_00119213;
          break;
        }
        local_b4 = (this->trail).sz;
        vec<int>::push(&this->trail_lim,(int *)&local_b4);
      }
      this->decisions = this->decisions + 1;
      LVar9 = pickBranchLit(this);
      if (LVar9.x == -2) {
        return (lbool)'\0';
      }
      this->lastDecision = LVar9.x >> 1;
LAB_00119213:
      local_b4 = (this->trail).sz;
      vec<int>::push(&this->trail_lim,(int *)&local_b4);
      uncheckedEnqueue(this,LVar9,(this->trail_lim).sz,0xffffffff);
    }
    if (this->current_heuristic < CHB) {
      piVar14 = &this->var_decay_timer;
      *piVar14 = *piVar14 + -1;
      if ((*piVar14 == 0) && (this->var_decay < 0.95)) {
        this->var_decay_timer = this->var_decay_timer_init;
        this->var_decay = this->var_decay + 0.01;
      }
    }
    else {
      dVar20 = this->step_size;
      if (this->min_step_size <= dVar20 && dVar20 != this->min_step_size) {
        this->step_size = dVar20 - this->step_size_dec;
      }
    }
    uVar13 = this->conflicts + 1;
    this->conflicts = uVar13;
    *local_78 = *local_78 + -1;
    if ((uVar13 == 100000) && ((this->learnts_core).sz < 100)) {
      this->core_lbd_cut = 5;
    }
    CVar24 = FindConflictLevel(this,cind);
    if (CVar24.nHighestLevel == 0) {
      return (lbool)'\x01';
    }
    if (((undefined1  [12])CVar24 & (undefined1  [12])0x1) != (undefined1  [12])0x0) {
      uVar12 = CVar24._0_8_ >> 0x20;
      if ((CRef)local_a8 != cind) {
        uVar12 = CVar24._0_8_;
      }
      iVar8 = (int)uVar12 + -1;
      if ((int)uVar12 < 1) {
        iVar8 = 0;
      }
      cancelUntil(this,iVar8,false);
      goto LAB_00118f6d;
    }
    if (local_a0->data != (Lit *)0x0) {
      (this->learnt_clause).sz = 0;
    }
    dVar10 = this->current_heuristic;
    if (this->conflicts < 0xc351) {
      if ((dVar10 & ~CHB) != VSIDS_DISTANCE) {
        if (this->verbosity != 0) {
          puts("c set DISTANCE to 1");
        }
        enableDISTANCEheuristic(this);
        goto LAB_001193be;
      }
LAB_001193c9:
      if (dVar10 == VSIDS_DISTANCE) {
        collectFirstUIP(this,cind);
      }
    }
    else if ((dVar10 & ~CHB) == VSIDS_DISTANCE) {
      if (this->verbosity != 0) {
        puts("c set DISTANCE to 0");
      }
      disableDISTANCEheuristic(this);
LAB_001193be:
      dVar10 = this->current_heuristic;
      goto LAB_001193c9;
    }
    analyze(this,cind,local_a0,(int *)&local_94,(int *)&local_98);
    if ((((this->confl_to_chrono < 0) || (this->confl_to_chrono <= (long)this->conflicts)) &&
        (-1 < this->chrono)) && (this->chrono <= (long)(this->trail_lim).sz - (long)(int)local_94))
    {
      this->chrono_backtrack = this->chrono_backtrack + 1;
      uVar11 = CVar24.nHighestLevel - 1;
      bVar7 = false;
    }
    else {
      this->non_chrono_backtrack = this->non_chrono_backtrack + 1;
      bVar7 = true;
      uVar11 = local_94;
    }
    local_b0 = local_94;
    cancelUntil(this,uVar11,bVar7);
    local_90 = (ulong)local_98;
    local_98 = local_98 - 1;
    local_a8 = CONCAT44(local_a8._4_4_,local_98);
    uVar11 = local_98;
    if (this->current_heuristic < CHB) {
      this->conflicts_VSIDS = this->conflicts_VSIDS + 1;
      MyQueue<int>::push(local_50,local_98);
      uVar11 = 0x32;
      if ((int)(CRef)local_a8 < 0x32) {
        uVar11 = (CRef)local_a8;
      }
      this->global_lbd_sum = (float)(int)uVar11 + this->global_lbd_sum;
      bVar6 = false;
      uVar11 = (CRef)local_a8;
    }
    ps = local_a0;
    shareViaCallback<Minisat::vec<Minisat::Lit>>(this,local_a0,uVar11);
    if ((this->learnt_clause).sz == 1) {
      LVar9.x = ((this->learnt_clause).data)->x;
      from = 0xffffffff;
      uVar11 = 0;
    }
    else {
      local_b4 = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>(local_58,ps,true);
      puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      *(ulong *)(puVar4 + local_b4) =
           *(ulong *)(puVar4 + local_b4) & 0xffffffffc000001f |
           (ulong)(((CRef)local_a8 & 0x1ffffff) << 5);
      if (this->core_lbd_cut < (int)(CRef)local_a8) {
        if ((int)local_90 < 8) {
          vec<unsigned_int>::push(local_70,&local_b4);
          uVar12 = (ulong)local_b4;
          puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
          *(ulong *)(puVar4 + uVar12) = *(ulong *)(puVar4 + uVar12) & 0xfffffffffffffffc | 2;
          goto LAB_00119578;
        }
        vec<unsigned_int>::push(local_80,&local_b4);
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        puVar2 = (ulong *)(puVar4 + local_b4);
        dVar20 = this->cla_inc;
        fVar23 = (float)((double)*(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) + dVar20);
        *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) = fVar23;
        if (1e+20 < fVar23) {
          lVar15 = (long)(this->learnts_local).sz;
          if (0 < lVar15) {
            puVar5 = local_80->data;
            lVar17 = 0;
            do {
              puVar2 = (ulong *)(puVar4 + puVar5[lVar17]);
              *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) =
                   *(float *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 8) * 1e-20;
              lVar17 = lVar17 + 1;
            } while (lVar15 != lVar17);
          }
          this->cla_inc = dVar20 * 1e-20;
        }
      }
      else {
        vec<unsigned_int>::push(local_60,&local_b4);
        uVar12 = (ulong)local_b4;
        puVar2 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar12);
        *puVar2 = *puVar2 | 3;
LAB_00119578:
        puVar2 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar12);
        *(int *)((long)puVar2 + (*puVar2 >> 0x22) * 4 + 0xc) = (int)this->conflicts;
      }
      attachClause(this,local_b4);
      puVar1 = &(this->statistics).solveSteps;
      *puVar1 = *puVar1 + 1;
      LVar9.x = ((this->learnt_clause).data)->x;
      from = local_b4;
      uVar11 = local_b0;
    }
    uncheckedEnqueue(this,LVar9,uVar11,from);
    if (this->drup_file != (FILE *)0x0) {
      binDRUP<Minisat::vec<Minisat::Lit>>(this,'a',local_a0,this->drup_file);
    }
    if (this->current_heuristic < CHB) {
      this->var_inc = (1.0 / this->var_decay) * this->var_inc;
    }
    this->cla_inc = (1.0 / this->clause_decay) * this->cla_inc;
    if ((0 < this->verbosity) && (this->conflicts % (ulong)(long)this->status_every == 0)) {
      piVar14 = local_68;
      if ((this->trail_lim).sz != 0) {
        piVar14 = (this->trail_lim).data;
      }
      local_90 = CONCAT44(local_90._4_4_,(int)this->dec_vars - *piVar14);
      local_b0 = (uint)this->max_learnts;
      local_84 = (uint)this->clauses_literals;
      local_88 = (this->clauses).sz;
      iVar8 = (this->learnts_tier2).sz + (this->learnts_core).sz + (this->learnts_local).sz;
      auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)this->learnts_literals);
      auVar22._8_4_ = (int)(this->learnts_literals >> 0x20);
      auVar22._12_4_ = 0x45300000;
      dVar20 = auVar22._8_8_ - 1.9342813113834067e+25;
      local_48._8_4_ = SUB84(dVar20,0);
      local_48._0_8_ = (dVar20 + (auVar22._0_8_ - 4503599627370496.0)) / (double)iVar8;
      local_48._12_4_ = (int)((ulong)dVar20 >> 0x20);
      local_a8 = this->conflicts;
      dVar20 = progressEstimate(this);
      printf("c | %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n",local_48._0_8_,
             SUB84(dVar20 * 100.0,0),local_a8,local_90 & 0xffffffff,(ulong)local_88,(ulong)local_84,
             (ulong)local_b0,iVar8);
    }
    iVar8 = (this->trail).sz;
    if (this->max_trail < iVar8) {
      this->max_trail = iVar8;
      lVar15 = (long)(this->vardata).sz;
      if (0 < lVar15) {
        lVar17 = 0;
        do {
          bVar18 = (this->assigns).data[lVar17].value;
          if ((bVar18 & 2) != 0) {
            bVar18 = (this->polarity).data[lVar17];
          }
          (this->top_trail_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar17] = bVar18 == 0;
          lVar17 = lVar17 + 1;
        } while (lVar15 != lVar17);
      }
    }
  } while( true );
}

Assistant:

lbool Solver::search(int &nof_conflicts)
{
    TRACE(std::cout << "c start search at level " << decisionLevel() << std::endl);
    assert(ok);
    int backtrack_level;
    int lbd;
    learnt_clause.clear();
    bool cached = false;
    starts++;

    // make sure that all unassigned variables are in the heap
    assert(trail.size() + order_heap->size() >= full_heap_size);

    freeze_ls_restart_num--;
    bool can_call_ls = true;

    // get clauses from parallel solving, if we want to receive
    if (consumeSharedCls != NULL && receiveClauses) consumeSharedCls(issuer);

    if (allow_rephasing && solve_starts + starts > state_change_time) {

        if (!called_initial_sls) call_ls(false);

        /* grow limit after each rephasing */
        state_change_time = state_change_time + state_change_time_inc;
        state_change_time_inc = state_change_time_inc *= state_change_time_inc_inc;

        /* actually rephase */
        if (rand() % 100 < 50)
            info_based_rephase();
        else
            rand_based_rephase();
    }


    // simplify
    //
    if (lcm && conflicts >= curSimplify * nbconfbeforesimplify) {
        TRACE(printf("c ### simplifyAll on conflict : %ld\n", conflicts);)
        if (verbosity >= 1)
            printf("c schedule LCM with: nbClauses: %d, nbLearnts_core: %d, nbLearnts_tier2: %d, nbLearnts_local: %d, "
                   "nbLearnts: %d\n",
                   clauses.size(), learnts_core.size(), learnts_tier2.size(), learnts_local.size(),
                   learnts_core.size() + learnts_tier2.size() + learnts_local.size());
        nbSimplifyAll++;
        if (!simplifyAll()) {
            return l_False;
        }
        curSimplify = (conflicts / nbconfbeforesimplify) + 1;
        nbconfbeforesimplify += incSimplify;
    }

    if (!okay()) return l_False;

    // check whether we want to do inprocessing
    inprocessing();

    prefetchAssumptions();
    CRef this_confl = CRef_Undef, prev_confl = CRef_Undef;

    for (;;) {

        TRACE(check_invariants();)

        TRACE(printf("c propagate literals on level %d with trail size %d\n", decisionLevel(), trail.size());)
        CRef confl = propagate();

        if (confl != CRef_Undef) {
            prev_confl = this_confl;
            this_confl = confl;
            // CONFLICT
            if (usesVSIDS()) {
                if (--var_decay_timer == 0 && var_decay < 0.95)
                    var_decay_timer = var_decay_timer_init, var_decay += 0.01;
            } else if (step_size > min_step_size)
                step_size -= step_size_dec;

            conflicts++;
            nof_conflicts--;
            TRACE(printf("c hit conflict %ld\n", conflicts);)
            if (conflicts == 100000 && learnts_core.size() < 100) core_lbd_cut = 5;
            ConflictData data = FindConflictLevel(confl);
            if (data.nHighestLevel == 0) return l_False;
            // assert(prev_confl != this_confl && "we should not have duplicate conflicts in a row");
            if (data.bOnlyOneLitFromHighest) { //  && prev_confl != this_confl) {
                int btLevel = (prev_confl != this_confl) ? data.nHighestLevel - 1 : data.secondHighestLevel - 1;
                btLevel = btLevel >= 0 ? btLevel : 0;
                TRACE(std::cout << "c chronological backtracking, backtrack until level " << data.nHighestLevel - 1 << std::endl;
                      for (int i = 0; i < ca[confl].size(); ++i) {
                          Lit tl = ca[confl][i];
                          std::cout << "c     " << tl << "@" << level(var(tl)) << " with reason " << reason(var(tl)) << std::endl;
                      })
                cancelUntil(btLevel, false);
                continue;
            }

            learnt_clause.clear();
            if (conflicts > 50000) {
                if (considersDISTANCE()) {
                    if (verbosity) printf("c set DISTANCE to 0\n");
                    disableDISTANCEheuristic();
                }
            } else {
                if (!considersDISTANCE()) {
                    if (verbosity) printf("c set DISTANCE to 1\n");
                    enableDISTANCEheuristic();
                }
            }
            if (current_heuristic == VSIDS_DISTANCE) collectFirstUIP(confl);

            TRACE(std::cout << "c run conflict analysis on conflict clause [" << confl << "]: " << ca[confl] << std::endl);
            analyze(confl, learnt_clause, backtrack_level, lbd);
            TRACE(std::cout << "c retrieved learnt clause " << learnt_clause << std::endl);

            // check chrono backtrack condition
            if ((confl_to_chrono < 0 || confl_to_chrono <= (int64_t)conflicts) && chrono > -1 &&
                (decisionLevel() - backtrack_level) >= chrono) {
                ++chrono_backtrack;
                TRACE(std::cout << "c chronological backtracking until level " << data.nHighestLevel - 1 << std::endl);
                assert((level(var(learnt_clause[0])) == 0 || level(var(learnt_clause[0])) > data.nHighestLevel - 1) &&
                       "learnt clause is asserting");
                cancelUntil(data.nHighestLevel - 1, false);
            } else // default behavior
            {
                ++non_chrono_backtrack;
                TRACE(std::cout << "c non-chrono backtracking until level " << backtrack_level << std::endl);
                cancelUntil(backtrack_level, true);
            }

            lbd--;
            if (usesVSIDS()) {
                cached = false;
                conflicts_VSIDS++;
                lbd_queue.push(lbd);
                global_lbd_sum += (lbd > 50 ? 50 : lbd);
            }

            // share clause with interfaces (ipasir, hordesat)
            shareViaCallback(learnt_clause, lbd);

            if (learnt_clause.size() == 1) {
                uncheckedEnqueue(learnt_clause[0], 0);
            } else {
                CRef cr = ca.alloc(learnt_clause, true);
                TRACE(std::cout << "c allocate learnt clause " << learnt_clause << " with cref= " << cr << std::endl);
                ca[cr].set_lbd(lbd);
                if (lbd <= core_lbd_cut) {
                    learnts_core.push(cr);
                    ca[cr].mark(CORE);
                    ca[cr].touched() = conflicts;
                } else if (lbd <= 6) {
                    learnts_tier2.push(cr);
                    ca[cr].mark(TIER2);
                    ca[cr].touched() = conflicts;
                } else {
                    learnts_local.push(cr);
                    claBumpActivity(ca[cr]);
                }
                attachClause(cr);
                statistics.solveSteps++;

                uncheckedEnqueue(learnt_clause[0], backtrack_level, cr);
#ifdef PRINT_OUT
                std::cout << "new " << ca[cr] << "\n";
                std::cout << "ci " << learnt_clause[0] << " l " << backtrack_level << "\n";
#endif
            }
            if (drup_file) {
#ifdef BIN_DRUP
                binDRUP('a', learnt_clause, drup_file);
#else
                for (int i = 0; i < learnt_clause.size(); i++)
                    fprintf(drup_file, "%i ", (var(learnt_clause[i]) + 1) * (-2 * sign(learnt_clause[i]) + 1));
                fprintf(drup_file, "0\n");
#endif
            }

            if (usesVSIDS()) varDecayActivity();
            claDecayActivity();

            /*if (--learntsize_adjust_cnt == 0){
                learntsize_adjust_confl *= learntsize_adjust_inc;
                learntsize_adjust_cnt    = (int)learntsize_adjust_confl;
                max_learnts             *= learntsize_inc;

            }*/

            if (verbosity >= 1 && (conflicts % status_every) == 0)
                printf("c | %9d | %7d %8d %8d | %8d %8d %6.0f | %6.3f %% |\n", (int)conflicts,
                       (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals,
                       (int)max_learnts, nLearnts(), (double)learnts_literals / nLearnts(), progressEstimate() * 100);

            // the top_trail_soln should be update after each conflict
            if (trail.size() > max_trail) {
                max_trail = trail.size();

                int var_nums = nVars();
                for (int idx_i = 0; idx_i < var_nums; ++idx_i) {
                    lbool value_i = value(idx_i);
                    if (value_i == l_Undef)
                        top_trail_soln[idx_i] = !polarity[idx_i];
                    else {
                        top_trail_soln[idx_i] = value_i == l_True ? 1 : 0;
                    }
                }
            }

        } else {
            // NO CONFLICT
            if (solve_starts + starts > state_change_time) {

                if (can_call_ls && freeze_ls_restart_num < 1 && mediation_used &&
                    (trail.size() > (int)(conflict_ratio * nVars()) || trail.size() > (int)(percent_ratio * max_trail)) //&& up_time_ratio * search_start_cpu_time > ls_used_time
                ) {

                    can_call_ls = false;
                    mediation_used = false;
                    freeze_ls_restart_num = restarts_gap;
                    bool res = call_ls(true);

                    if (res) {
                        solved_by_ls = true;
                        return l_True;
                    }
                }
            }

            bool restart = false;
            if (!usesVSIDS())
                restart = nof_conflicts <= 0;
            else if (!cached) {
                restart = lbd_queue.full() && (lbd_queue.avg() * lbd_avg_compare_limit > global_lbd_sum / conflicts_VSIDS);
                cached = true;
            }
            if (restart || !withinBudget()) {
                TRACE(std::cout << "c interrupt search due to restart or budget" << std::endl);
                lbd_queue.clear();
                cached = false;
                // Reached bound on number of conflicts:
                progress_estimate = progressEstimate();

                int restartLevel = getRestartLevel();
                if (verbosity > 3)
                    printf("c trigger restart with target level %d from %d\n", restartLevel, decisionLevel());
                restartLevel = (assumptions.size() && restartLevel <= assumptions.size()) ? assumptions.size() : restartLevel;
                TRACE(std::cout << "c jump to level " << restartLevel << " for restart" << std::endl);
                cancelUntil(restartLevel);
                return l_Undef;
            }

            // Simplify the set of problem clauses:
            if (decisionLevel() == 0 && !simplify()) return l_False;

            if (core_size_lim != -1 && learnts_core.size() > core_size_lim) {
                TRACE(std::cout << "c reduce core learnt clauses" << std::endl);
                bool successful_reduced = reduceDB_Core();
                core_size_lim += core_size_lim * core_size_lim_inc;
                /* add extra penalty, if no success */
                if (!successful_reduced) core_size_lim += core_size_lim * core_size_lim_inc;
            }

            if (learnts_tier2.size() > 7000) {
                TRACE(std::cout << "c reduce tier 2 clauses" << std::endl);
                reduceDB_Tier2();
            }

            if (conflicts >= next_L_reduce) {
                next_L_reduce = conflicts + 15000;
                TRACE(std::cout << "c reduce learnt clauses" << std::endl);
                reduceDB();
            }

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()) {
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True) {
                    // Dummy decision level:
                    newDecisionLevel();
                } else if (value(p) == l_False) {
                    analyzeFinal(~p, conflict);
                    return l_False;
                } else {
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef) {
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef)
                    // Model found:
                    return l_True;

                lastDecision = var(next);
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            TRACE(std::cout << "c use literal " << next << " as decision literal on level " << decisionLevel() << std::endl);
            uncheckedEnqueue(next, decisionLevel());
#ifdef PRINT_OUT
            std::cout << "d " << next << " l " << decisionLevel() << "\n";
#endif
        }
    }

    // store minimum of assumptions and current level, to forward assumptions again
    last_used_assumptions = assumptions.size() > decisionLevel() ? decisionLevel() : assumptions.size();
}